

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

void sqlite3ExprAnalyzeAggList(NameContext *pNC,ExprList *pList)

{
  int iVar1;
  ExprList_item *pEVar2;
  Walker local_60;
  
  if ((pList != (ExprList *)0x0) && (0 < pList->nExpr)) {
    pEVar2 = pList->a;
    iVar1 = 0;
    do {
      local_60.xExprCallback = analyzeAggregate;
      local_60.xSelectCallback = analyzeAggregatesInSelect;
      local_60.xSelectCallback2 = analyzeAggregatesInSelectEnd;
      local_60.walkerDepth = 0;
      if (pEVar2->pExpr != (Expr *)0x0) {
        local_60.u.pNC = pNC;
        walkExpr(&local_60,pEVar2->pExpr);
      }
      iVar1 = iVar1 + 1;
      pEVar2 = pEVar2 + 1;
    } while (iVar1 < pList->nExpr);
  }
  return;
}

Assistant:

SQLITE_PRIVATE void sqlite3ExprAnalyzeAggList(NameContext *pNC, ExprList *pList){
  struct ExprList_item *pItem;
  int i;
  if( pList ){
    for(pItem=pList->a, i=0; i<pList->nExpr; i++, pItem++){
      sqlite3ExprAnalyzeAggregates(pNC, pItem->pExpr);
    }
  }
}